

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

Status __thiscall leveldb::VersionSet::WriteSnapshot(VersionSet *this,Writer *log)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  Slice *in_RDX;
  uint32_t *puVar5;
  ulong uVar6;
  int level;
  long lVar7;
  long in_FS_OFFSET;
  string record;
  VersionEdit edit;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  VersionEdit local_e0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  VersionEdit::VersionEdit(&local_e0);
  iVar3 = (*(log[2].dest_)->_vptr_WritableFile[3])();
  local_100._M_dataplus._M_p = (pointer)CONCAT44(extraout_var,iVar3);
  local_100._M_string_length = strlen(local_100._M_dataplus._M_p);
  VersionEdit::SetComparatorName(&local_e0,(Slice *)&local_100);
  paVar1 = &local_100.field_2;
  puVar5 = log[0xb].type_crc_ + 3;
  lVar7 = 0;
  do {
    if (*(size_type *)puVar5 != 0) {
      local_100._M_string_length = 0;
      local_100.field_2._M_local_buf[0] = '\0';
      local_100._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (&local_100,0,0,*(char **)(puVar5 + -2),*(size_type *)puVar5);
      VersionEdit::SetCompactPointer(&local_e0,(int)lVar7,(InternalKey *)&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != paVar1) {
        operator_delete(local_100._M_dataplus._M_p,
                        CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                 local_100.field_2._M_local_buf[0]) + 1);
      }
    }
    lVar7 = lVar7 + 1;
    puVar5 = puVar5 + 8;
  } while (lVar7 != 7);
  lVar7 = 0;
  do {
    lVar2 = *(long *)&log[0xb].block_offset_;
    lVar4 = *(long *)(lVar2 + 0x20 + lVar7 * 0x18);
    if (*(long *)(lVar2 + 0x28 + lVar7 * 0x18) != lVar4) {
      lVar2 = lVar2 + lVar7 * 0x18;
      uVar6 = 0;
      do {
        lVar4 = *(long *)(lVar4 + uVar6 * 8);
        VersionEdit::AddFile
                  (&local_e0,(int)lVar7,*(uint64_t *)(lVar4 + 8),*(uint64_t *)(lVar4 + 0x10),
                   (InternalKey *)(lVar4 + 0x18),(InternalKey *)(lVar4 + 0x38));
        uVar6 = uVar6 + 1;
        lVar4 = *(long *)(lVar2 + 0x20);
      } while (uVar6 < (ulong)(*(long *)(lVar2 + 0x28) - lVar4 >> 3));
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 7);
  local_100._M_string_length = 0;
  local_100.field_2._M_local_buf[0] = '\0';
  local_100._M_dataplus._M_p = (pointer)paVar1;
  VersionEdit::EncodeTo(&local_e0,&local_100);
  leveldb::log::Writer::AddRecord((Writer *)this,in_RDX);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != paVar1) {
    operator_delete(local_100._M_dataplus._M_p,
                    CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                             local_100.field_2._M_local_buf[0]) + 1);
  }
  VersionEdit::~VersionEdit(&local_e0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status VersionSet::WriteSnapshot(log::Writer* log) {
  // TODO: Break up into multiple records to reduce memory usage on recovery?

  // Save metadata
  VersionEdit edit;
  edit.SetComparatorName(icmp_.user_comparator()->Name());

  // Save compaction pointers
  for (int level = 0; level < config::kNumLevels; level++) {
    if (!compact_pointer_[level].empty()) {
      InternalKey key;
      key.DecodeFrom(compact_pointer_[level]);
      edit.SetCompactPointer(level, key);
    }
  }

  // Save files
  for (int level = 0; level < config::kNumLevels; level++) {
    const std::vector<FileMetaData*>& files = current_->files_[level];
    for (size_t i = 0; i < files.size(); i++) {
      const FileMetaData* f = files[i];
      edit.AddFile(level, f->number, f->file_size, f->smallest, f->largest);
    }
  }

  std::string record;
  edit.EncodeTo(&record);
  return log->AddRecord(record);
}